

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_subs(DisasContext_conflict14 *ctx,TCGv_i32 ret,TCGv_i32 r1,TCGv_i32 r2)

{
  TCGContext_conflict9 *tcg_ctx;
  TCGTemp *local_18;
  TCGv_i32 local_10;
  TCGv_i32 local_8;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  local_18 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_10 = r1 + (long)tcg_ctx;
  local_8 = r2 + (long)tcg_ctx;
  tcg_gen_callN_tricore(tcg_ctx,helper_sub_ssov,(TCGTemp *)(ret + (long)tcg_ctx),3,&local_18);
  return;
}

Assistant:

static inline void gen_subs(DisasContext *ctx, TCGv ret, TCGv r1, TCGv r2)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    gen_helper_sub_ssov(tcg_ctx, ret, tcg_ctx->cpu_env, r1, r2);
}